

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.c
# Opt level: O1

void trimLine(void)

{
  size_t sVar1;
  long lVar2;
  
  sVar1 = strlen(inputBuffer);
  if (1 < (int)(uint)sVar1) {
    lVar2 = (ulong)((uint)sVar1 & 0x7fffffff) + 1;
    do {
      if (0x20 < (ulong)(byte)(&DAT_001111ce)[lVar2]) {
        return;
      }
      if ((0x100000600U >> ((ulong)(byte)(&DAT_001111ce)[lVar2] & 0x3f) & 1) == 0) {
        return;
      }
      (&DAT_001111ce)[lVar2] = 0;
      lVar2 = lVar2 + -1;
    } while (2 < lVar2);
  }
  return;
}

Assistant:

void trimLine()
{
    int index = (int)strlen(inputBuffer) - 1;

    while(index > 0) {
        if((inputBuffer[index] == ' ') || (inputBuffer[index] == '\t') || (inputBuffer[index] == '\n')) {
            inputBuffer[index--] = 0;
        } else {
            break;
        }
    }
}